

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

int er_hint_cmp_fn(State *a,State *b,hash_fns_t *fns)

{
  uint uVar1;
  Hint **ppHVar2;
  Hint **ppHVar3;
  Hint *pHVar4;
  Hint *pHVar5;
  Rule *pRVar6;
  Rule *pRVar7;
  int iVar8;
  ulong uVar9;
  
  uVar1 = (a->error_recovery_hints).n;
  iVar8 = 1;
  if (uVar1 == (b->error_recovery_hints).n) {
    if ((ulong)uVar1 != 0) {
      ppHVar2 = (a->error_recovery_hints).v;
      ppHVar3 = (b->error_recovery_hints).v;
      uVar9 = 0;
      do {
        pHVar4 = ppHVar2[uVar9];
        pHVar5 = ppHVar3[uVar9];
        if (pHVar4->depth != pHVar5->depth) {
          return 1;
        }
        pRVar6 = pHVar4->rule;
        pRVar7 = pHVar5->rule;
        iVar8 = strcmp((((pRVar6->elems).v[(pRVar6->elems).n - 1]->e).term)->string,
                       (((pRVar7->elems).v[(pRVar7->elems).n - 1]->e).term)->string);
        if (iVar8 != 0) {
          return 1;
        }
        if (pRVar6->prod->index != pRVar7->prod->index) {
          return 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int er_hint_cmp_fn(State *a, State *b, hash_fns_t *fns) {
  uint i;
  VecHint *sa = &a->error_recovery_hints, *sb = &b->error_recovery_hints;
  Term *ta, *tb;
  (void)fns;
  if (sa->n != sb->n) return 1;
  for (i = 0; i < sa->n; i++) {
    ta = sa->v[i]->rule->elems.v[sa->v[i]->rule->elems.n - 1]->e.term;
    tb = sb->v[i]->rule->elems.v[sb->v[i]->rule->elems.n - 1]->e.term;
    if (sa->v[i]->depth != sb->v[i]->depth || strcmp(ta->string, tb->string) ||
        sa->v[i]->rule->prod->index != sb->v[i]->rule->prod->index)
      return 1;
  }
  return 0;
}